

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O2

void fast_test(void)

{
  PtTimestamp PVar1;
  PtTimestamp PVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int local_9c;
  PortMidiStream *midi;
  int local_8c;
  char line [80];
  
  Pt_Start(1,(PtCallback *)0x0,(void *)0x0);
  Pm_OpenOutput(&midi,deviceno,(void *)0x0,0,Pt_Time,(void *)0x0,latency);
  printf("Midi Output opened with %ld ms latency.\n",(long)latency);
  PVar1 = Pt_Time();
  while( true ) {
    PVar2 = Pt_Time();
    if (PVar1 + 1000 <= PVar2) break;
    usleep(10000);
  }
  puts("sending output...");
  fflush(_stdout);
  PVar2 = Pt_Time();
  iVar3 = latency * 2;
  if (expired_timestamps == 0) {
    iVar3 = 0;
  }
  uVar5 = 0x3c;
  uVar7 = 0;
  local_9c = 1000;
  PVar2 = PVar2 - iVar3;
  local_8c = PVar1 + 1000;
  while (uVar6 = PVar2 - local_8c,
        SBORROW4(uVar6,duration * 1000) != (int)(uVar6 + duration * -1000) < 0) {
    iVar3 = msgrate * uVar6;
    while ((int)uVar7 < iVar3 / 1000) {
      uVar4 = (uVar5 & 0xff) * 0x100;
      Pm_WriteShort(midi,PVar2,uVar4 + 0x640090);
      Pm_WriteShort(midi,PVar2,uVar4 | 0x90);
      uVar7 = uVar7 + 2;
      uVar5 = (int)(uVar5 - 0x3b) % 0xc + 0x3c;
      if (local_9c <= (int)uVar6) {
        printf("%d at %dms\n",(ulong)uVar7,(ulong)uVar6);
        fflush(_stdout);
        local_9c = local_9c + 1000;
      }
    }
    PVar2 = Pt_Time();
  }
  printf("ready to close and terminate... (type RETURN):");
  fgets(line,0x50,_stdin);
  Pm_Close(midi);
  Pm_Terminate();
  puts("done closing and terminating...");
  return;
}

Assistant:

void fast_test()
{
    PmStream * midi;
	char line[80];

    /* It is recommended to start timer before PortMidi */
    TIME_START;

	/* open output device */
    Pm_OpenOutput(&midi, 
                  deviceno, 
                  DRIVER_INFO,
                  OUTPUT_BUFFER_SIZE, 
                  (int32_t (*)(void *)) Pt_Time,
                  NULL,
                  latency);
    printf("Midi Output opened with %ld ms latency.\n", (long) latency);

    /* wait a sec after printing previous line */
    PmTimestamp start = Pt_Time() + 1000;
    while (start > Pt_Time()) {
        Sleep(10);
    }
    printf("sending output...\n");
    fflush(stdout); /* make sure message goes to console */

    /* every 10ms send on/off pairs at timestamps set to current time */
    PmTimestamp now = Pt_Time();
    int msgcnt = 0;
    int pitch = 60;
    int printtime = 1000;
    /* if expired_timestamps, we want to send timestamps that have
     * expired. They should be sent immediately, but there's a suggestion
     * that negative delay might cause problems in the ALSA implementation
     * so this is something we can test using the -n flag.
     */
    if (expired_timestamps) {
        now = now - 2 * latency;
    }
    while (now - start < duration *  1000) {
        /* how many messages do we send? Total should be
         *     (elapsed * rate) / 1000
         */
        int send_total = ((now - start) * msgrate) / 1000;
        while (msgcnt < send_total) {
            Pm_WriteShort(midi, now, Pm_Message(0x90, pitch, 100));
            Pm_WriteShort(midi, now, Pm_Message(0x90, pitch, 0));
            msgcnt += 2;
            /* play 60, 61, 62, ... 71, then wrap back to 60, 61, ... */
            pitch = (pitch - 59) % 12 + 60;
            if (now - start >= printtime) {
                printf("%d at %dms\n", msgcnt, now - start);
                fflush(stdout); /* make sure message goes to console */
                printtime += 1000; /* next msg in 1s */
            }
        }
        now = Pt_Time();
    }
    /* close device (this not explicitly needed in most implementations) */
    printf("ready to close and terminate... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
	
    Pm_Close(midi);
    Pm_Terminate();
    printf("done closing and terminating...\n");
}